

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersection.cpp
# Opt level: O1

IntersectionData *
vera::intersection(IntersectionData *__return_storage_ptr__,Line *_line,Plane *_plane)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  __return_storage_ptr__->distance = 0.0;
  __return_storage_ptr__->hit = false;
  fVar8 = (float)*(undefined8 *)_plane;
  fVar9 = (float)((ulong)*(undefined8 *)_plane >> 0x20);
  fVar1 = *(float *)(_plane + 8);
  fVar2 = _line->m_points[0].field_0.x;
  fVar3 = _line->m_points[0].field_1.y;
  fVar4 = _line->m_points[0].field_2.z;
  if ((fVar4 - fVar1) * fVar1 + (fVar3 - fVar9) * fVar9 + (fVar2 - fVar8) * fVar8 < 0.0 ==
      0.0 <= (_line->m_points[1].field_2.z - fVar1) * fVar1 +
             (_line->m_points[1].field_1.y - fVar9) * fVar9 +
             (_line->m_points[1].field_0.x - fVar8) * fVar8) {
    fVar5 = (_line->m_direction).field_0.x;
    fVar6 = (_line->m_direction).field_1.y;
    fVar7 = (_line->m_direction).field_2.z;
    fVar10 = fVar1 * fVar7 + fVar9 * fVar6 + fVar8 * fVar5;
    if (((1e-10 < ABS(fVar10)) &&
        (fVar10 = ((fVar1 - fVar4) * fVar1 + (fVar9 - fVar3) * fVar9 + (fVar8 - fVar2) * fVar8) /
                  fVar10, fVar10 <= 1.0)) && (0.0 <= fVar10)) {
      __return_storage_ptr__->hit = true;
      (__return_storage_ptr__->position).field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(fVar2 + fVar5 * fVar10);
      (__return_storage_ptr__->position).field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)(fVar3 + fVar6 * fVar10);
      (__return_storage_ptr__->position).field_2.z = fVar4 + fVar7 * fVar10;
      return __return_storage_ptr__;
    }
  }
  __return_storage_ptr__->hit = false;
  return __return_storage_ptr__;
}

Assistant:

IntersectionData intersection(const Line& _line, const Plane& _plane) {
    IntersectionData idata;
    
    float dist1 = distance(_line[0], _plane);
    float dist2 = distance(_line[1], _plane);
    int pos1 = sign(dist1);
    int pos2 = sign(dist2);
    
    if (pos1==pos2) {
        idata.hit = false;
        return idata;
    }
    
    float u = 0.0;
    float denom = glm::dot(_plane.getNormal(),_line.getDireciton());
    
    // check if ray is paralles to plane:
    
    if (fabs(denom) > EPS) {
        u= glm::dot(_plane.getNormal(),_plane.getOrigin()-_line[0])/denom;
        // check if intersection is within line-segment:
        if (u>1.0 || u<0) {
            idata.hit = false;
            return idata;
        }
        idata.hit=true;
        idata.position = _line[0]+_line.getDireciton()*u;
    }
    else
        idata.hit = false;
    

    return idata;
}